

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_ghost.cpp
# Opt level: O0

void Omega_h::partition_by_elems(Mesh *mesh,bool verbose)

{
  Int ent_dim;
  LO nrroots;
  Dist local_218;
  Remotes local_188;
  undefined1 local_168 [24];
  Dist dist;
  Read<int> local_a8;
  undefined1 local_98 [8];
  Remotes owned2owners;
  undefined1 local_68 [8];
  LOs owned2all;
  undefined1 local_48 [8];
  Read<signed_char> marked_owned;
  Remotes all2owners;
  Int dim;
  bool verbose_local;
  Mesh *mesh_local;
  
  ent_dim = Mesh::dim(mesh);
  Mesh::ask_owners((Remotes *)&marked_owned.write_.shared_alloc_.direct_ptr,mesh,ent_dim);
  Mesh::owned((Mesh *)local_48,(Int)mesh);
  Read<signed_char>::Read
            ((Read<signed_char> *)&owned2owners.idxs.write_.shared_alloc_.direct_ptr,
             (Read<signed_char> *)local_48);
  collect_marked((Omega_h *)local_68,
                 (Read<signed_char> *)&owned2owners.idxs.write_.shared_alloc_.direct_ptr);
  Read<signed_char>::~Read((Read<signed_char> *)&owned2owners.idxs.write_.shared_alloc_.direct_ptr);
  Read<int>::Read(&local_a8,(Read<int> *)local_68);
  Remotes::Remotes((Remotes *)
                   &dist.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(Remotes *)&marked_owned.write_.shared_alloc_.direct_ptr);
  unmap((Remotes *)local_98,&local_a8,
        (Remotes *)
        &dist.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  Remotes::~Remotes((Remotes *)
                    &dist.comm_[1].super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
  Read<int>::~Read(&local_a8);
  Mesh::comm((Mesh *)local_168);
  Remotes::Remotes(&local_188,(Remotes *)local_98);
  nrroots = Mesh::nelems(mesh);
  Dist::Dist((Dist *)(local_168 + 0x10),(CommPtr *)local_168,&local_188,nrroots);
  Remotes::~Remotes(&local_188);
  std::shared_ptr<Omega_h::Comm>::~shared_ptr((shared_ptr<Omega_h::Comm> *)local_168);
  Dist::Dist(&local_218,(Dist *)(local_168 + 0x10));
  migrate_mesh(mesh,&local_218,OMEGA_H_ELEM_BASED,verbose);
  Dist::~Dist(&local_218);
  Dist::~Dist((Dist *)(local_168 + 0x10));
  Remotes::~Remotes((Remotes *)local_98);
  Read<int>::~Read((Read<int> *)local_68);
  Read<signed_char>::~Read((Read<signed_char> *)local_48);
  Remotes::~Remotes((Remotes *)&marked_owned.write_.shared_alloc_.direct_ptr);
  return;
}

Assistant:

void partition_by_elems(Mesh* mesh, bool verbose) {
  auto dim = mesh->dim();
  auto all2owners = mesh->ask_owners(dim);
  auto marked_owned = mesh->owned(dim);
  auto owned2all = collect_marked(marked_owned);
  auto owned2owners = unmap(owned2all, all2owners);
  auto dist = Dist(mesh->comm(), owned2owners, mesh->nelems());
  migrate_mesh(mesh, dist, OMEGA_H_ELEM_BASED, verbose);
}